

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

void Wlc_PrsStop(Wlc_Prs_t *p)

{
  Vec_Str_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  
  if (p->pNtk != (Wlc_Ntk_t *)0x0) {
    Wlc_NtkFree(p->pNtk);
  }
  if (p->pMemTable != (Mem_Flex_t *)0x0) {
    Mem_FlexStop(p->pMemTable,0);
  }
  __ptr = p->vPoPairs;
  if (__ptr != (Vec_Str_t *)0x0) {
    if (__ptr->pArray != (char *)0x0) {
      free(__ptr->pArray);
      p->vPoPairs->pArray = (char *)0x0;
      __ptr = p->vPoPairs;
      if (__ptr == (Vec_Str_t *)0x0) goto LAB_002f33cf;
    }
    free(__ptr);
    p->vPoPairs = (Vec_Str_t *)0x0;
  }
LAB_002f33cf:
  __ptr_00 = p->vTables;
  if (__ptr_00 != (Vec_Ptr_t *)0x0) {
    if (__ptr_00->pArray != (void **)0x0) {
      free(__ptr_00->pArray);
      p->vTables->pArray = (void **)0x0;
      __ptr_00 = p->vTables;
      if (__ptr_00 == (Vec_Ptr_t *)0x0) goto LAB_002f3405;
    }
    free(__ptr_00);
    p->vTables = (Vec_Ptr_t *)0x0;
  }
LAB_002f3405:
  Vec_IntFree(p->vLines);
  Vec_IntFree(p->vStarts);
  Vec_IntFree(p->vFanins);
  free(p->pBuffer);
  free(p);
  return;
}

Assistant:

void Wlc_PrsStop( Wlc_Prs_t * p )
{
    if ( p->pNtk )
        Wlc_NtkFree( p->pNtk );
    if ( p->pMemTable )
        Mem_FlexStop( p->pMemTable, 0 );
    Vec_StrFreeP( &p->vPoPairs );
    Vec_PtrFreeP( &p->vTables );
    Vec_IntFree( p->vLines );
    Vec_IntFree( p->vStarts );
    Vec_IntFree( p->vFanins );
    ABC_FREE( p->pBuffer );
    ABC_FREE( p );
}